

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteAliasedRaw
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  int iVar1;
  uint8 *puVar2;
  
  if ((long)size < (long)(this->end_ + (0x10 - (long)ptr))) {
    puVar2 = WriteRaw(this,data,size,ptr);
    return puVar2;
  }
  puVar2 = Trim(this,ptr);
  iVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[5])(this->stream_,data,(ulong)(uint)size);
  if ((char)iVar1 == '\0') {
    this->had_error_ = true;
    puVar2 = this->buffer_;
    this->end_ = this->buffer_ + 0x10;
  }
  return puVar2;
}

Assistant:

uint8* EpsCopyOutputStream::WriteAliasedRaw(const void* data, int size,
                                            uint8* ptr) {
  if (size < GetSize(ptr)
  ) {
    return WriteRaw(data, size, ptr);
  } else {
    ptr = Trim(ptr);
    if (stream_->WriteAliasedRaw(data, size)) return ptr;
    return Error();
  }
}